

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

void __thiscall Imf_2_5::SampleCountChannel::set(SampleCountChannel *this,int r,uint *newNumSamples)

{
  int iVar1;
  ImageLevel *pIVar2;
  ImageChannel *in_RDI;
  int i;
  int y;
  int x;
  uint in_stack_000000b4;
  int in_stack_000000b8;
  int in_stack_000000bc;
  SampleCountChannel *in_stack_000000c0;
  undefined4 local_24;
  
  pIVar2 = ImageChannel::level(in_RDI);
  ImageLevel::dataWindow(pIVar2);
  pIVar2 = ImageChannel::level(in_RDI);
  ImageLevel::dataWindow(pIVar2);
  local_24 = 0;
  while( true ) {
    iVar1 = ImageChannel::pixelsPerRow(in_RDI);
    if (iVar1 <= local_24) break;
    set(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b4);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void
SampleCountChannel::set (int r, unsigned int newNumSamples[])
{
    int x = level().dataWindow().min.x;
    int y = r + level().dataWindow().min.x;

    for (int i = 0; i < pixelsPerRow(); ++i, ++x)
        set (x, y, newNumSamples[i]);
}